

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<Fad<Fad<double>_>_>::Resize(TPZVec<Fad<Fad<double>_>_> *this,int64_t newsize)

{
  undefined8 *puVar1;
  Fad<Fad<double>_> *pFVar2;
  double dVar3;
  undefined1 auVar4 [16];
  Fad<Fad<double>_> *pFVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t *piVar9;
  long lVar10;
  long lVar11;
  Fad<double> *pFVar12;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar10 = this->fNElements;
  if (lVar10 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<Fad<double>_> *)0x0) {
        dVar3 = pFVar2[-1].defaultVal.defaultVal;
        if (dVar3 != 0.0) {
          pFVar5 = pFVar2 + (long)dVar3 + -1;
          lVar10 = (long)dVar3 * -0x58;
          do {
            pFVar12 = &pFVar5->val_;
            Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(pFVar12 + 1) + 1));
            Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(pFVar12 + 1));
            Fad<double>::~Fad(pFVar12);
            pFVar5 = (Fad<Fad<double>_> *)(pFVar12 + -3);
            lVar10 = lVar10 + 0x58;
          } while (lVar10 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar3 * 0x58 + 8);
      }
      this->fStore = (Fad<Fad<double>_> *)0x0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = newsize;
      uVar7 = SUB168(auVar4 * ZEXT816(0x58),0);
      uVar8 = uVar7 + 8;
      if (0xfffffffffffffff7 < uVar7) {
        uVar8 = 0xffffffffffffffff;
      }
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x58),8) == 0) {
        uVar7 = uVar8;
      }
      piVar9 = (int64_t *)operator_new__(uVar7);
      *piVar9 = newsize;
      lVar11 = 0;
      do {
        *(undefined8 *)((long)piVar9 + lVar11 + 0x10) = 0;
        *(undefined4 *)((long)piVar9 + lVar11 + 0x18) = 0;
        puVar1 = (undefined8 *)((long)piVar9 + lVar11 + 0x50);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)piVar9 + lVar11 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar9 + lVar11 + 0x30) = 0;
        puVar1 = (undefined8 *)((long)piVar9 + lVar11 + 0x38);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar9 + lVar11 + 0x48) = 0;
        lVar11 = lVar11 + 0x58;
      } while (newsize * 0x58 - lVar11 != 0);
      if (newsize <= lVar10) {
        lVar10 = newsize;
      }
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          pFVar2 = this->fStore;
          *(undefined8 *)((long)piVar9 + lVar11 + 0x10) =
               *(undefined8 *)((long)&(pFVar2->val_).val_ + lVar11);
          Vector<double>::operator=
                    ((Vector<double> *)((long)piVar9 + lVar11 + 0x18),
                     (Vector<double> *)((long)&(pFVar2->val_).dx_.num_elts + lVar11));
          *(undefined8 *)((long)piVar9 + lVar11 + 0x28) =
               *(undefined8 *)((long)&(pFVar2->val_).defaultVal + lVar11);
          Vector<Fad<double>_>::operator=
                    ((Vector<Fad<double>_> *)((long)piVar9 + lVar11 + 0x30),
                     (Vector<Fad<double>_> *)((long)&(pFVar2->dx_).num_elts + lVar11));
          *(undefined8 *)((long)piVar9 + lVar11 + 0x40) =
               *(undefined8 *)((long)&(pFVar2->defaultVal).val_ + lVar11);
          Vector<double>::operator=
                    ((Vector<double> *)((long)piVar9 + lVar11 + 0x48),
                     (Vector<double> *)((long)&(pFVar2->defaultVal).dx_.num_elts + lVar11));
          *(undefined8 *)((long)piVar9 + lVar11 + 0x58) =
               *(undefined8 *)((long)&(pFVar2->defaultVal).defaultVal + lVar11);
          lVar11 = lVar11 + 0x58;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<Fad<double>_> *)0x0) {
        dVar3 = pFVar2[-1].defaultVal.defaultVal;
        if (dVar3 != 0.0) {
          pFVar5 = pFVar2 + (long)dVar3 + -1;
          lVar10 = (long)dVar3 * -0x58;
          do {
            pFVar12 = &pFVar5->val_;
            Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(pFVar12 + 1) + 1));
            Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(pFVar12 + 1));
            Fad<double>::~Fad(pFVar12);
            pFVar5 = (Fad<Fad<double>_> *)(pFVar12 + -3);
            lVar10 = lVar10 + 0x58;
          } while (lVar10 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar3 * 0x58 + 8);
      }
      this->fStore = (Fad<Fad<double>_> *)(piVar9 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}